

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O1

size_t CMact_on_data(CMConnection conn,CMbuffer cm_buffer,char *buffer,size_t length)

{
  CManager cm;
  CMFormat format;
  CMUnregCMHandler p_Var1;
  FILE *pFVar2;
  CMHandlerFunc p_Var3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  __pid_t _Var14;
  ulong uVar15;
  ulong uVar16;
  uint *buffer_00;
  undefined8 uVar17;
  char *pcVar18;
  CMincoming_format_list cm_format;
  ssize_t length_00;
  undefined8 uVar19;
  CMbuffer p_Var20;
  pthread_t pVar21;
  uint uVar22;
  byte bVar23;
  ulong uVar24;
  attr_list l2;
  uint uVar25;
  long lVar26;
  long lVar27;
  size_t sVar28;
  size_t length_01;
  size_t sVar29;
  byte *data_buffer;
  FILE *pFVar30;
  byte bVar31;
  ulong uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  CMbuffer cmb;
  uint uVar36;
  CManager p_Var37;
  long lVar38;
  timespec ts;
  char *decode_buffer;
  CMbuffer local_a0;
  attr_list local_98;
  timespec local_60;
  size_t local_50;
  void *local_48;
  uint local_40;
  uint local_3c;
  CMbuffer local_38;
  
  local_48 = (void *)0x0;
  if (length < 4) {
    return 4 - length;
  }
  cm = conn->cm;
  uVar35 = (uint)*(ushort *)(buffer + 1);
  uVar10 = uVar35 << 8;
  iVar12 = 1;
  if (uVar10 < 0x4d4200) {
    if (uVar10 < 0x484d00) {
      if (uVar35 == 0x414d) {
        iVar12 = 1;
        goto LAB_0011c95e;
      }
      if (uVar35 != 0x424d) {
        if (uVar35 != 0x444d) goto LAB_0011cb41;
        bVar6 = true;
        goto LAB_0011c909;
      }
      bVar23 = 1;
      iVar12 = 1;
LAB_0011c966:
      bVar7 = false;
      bVar6 = true;
      bVar5 = true;
    }
    else {
      if (uVar35 != 0x484d) {
        if (uVar35 != 0x4c4d) {
          if (uVar35 != 0x4d41) goto LAB_0011cb41;
          iVar12 = 1;
          goto LAB_0011c91d;
        }
        iVar12 = 0;
LAB_0011c95e:
        bVar23 = 0;
        goto LAB_0011c966;
      }
      bVar6 = false;
LAB_0011c909:
      bVar23 = 0;
      bVar7 = false;
      bVar5 = false;
    }
LAB_0011c969:
    iVar13 = 1;
    bVar8 = false;
  }
  else {
    if (uVar10 < 0x4d4c00) {
      if (uVar35 == 0x4d42) {
        bVar23 = 1;
        iVar12 = 1;
LAB_0011c925:
        bVar7 = false;
        bVar6 = true;
        bVar5 = true;
      }
      else {
        if (uVar35 == 0x4d44) {
          bVar6 = true;
        }
        else {
          if (uVar35 != 0x4d48) {
LAB_0011cb41:
            IntCManager_unlock(cm,
                               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                               ,0x939);
            iVar12 = *(int *)buffer;
            if ((iVar12 == 0x5042494f) || (iVar12 == 0x4f494250)) {
              iVar12 = CM_pbio_query(conn,conn->trans,buffer,length);
              IntCManager_lock(cm,
                               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                               ,0x942);
              return (long)iVar12;
            }
            if (0 < (long)foreign_handler_count) {
              lVar27 = 0;
              do {
                if (*(int *)((long)&foreign_handler_list->header + lVar27) == iVar12) {
                  iVar12 = (**(code **)((long)&foreign_handler_list->handler + lVar27))
                                     (conn,conn->trans,buffer,length);
                  IntCManager_lock(cm,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                                   ,0x947);
                  if (iVar12 != -1) {
                    return 0;
                  }
                  goto LAB_0011d018;
                }
                lVar27 = lVar27 + 0x10;
              } while ((long)foreign_handler_count * 0x10 != lVar27);
            }
            IntCManager_lock(cm,
                             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                             ,0x947);
LAB_0011d018:
            printf("Unknown message on connection %p, failed %d, closed %d, %x\n",conn,
                   (ulong)(uint)conn->failed,(ulong)(uint)conn->closed,(ulong)*(uint *)buffer);
            iVar12 = CMtrace_val[7];
            if (conn->cm->CMTrace_file == (FILE *)0x0) {
              iVar12 = CMtrace_init(conn->cm,CMFreeVerbose);
            }
            if (iVar12 != 0) {
              if (CMtrace_PID != 0) {
                pFVar30 = (FILE *)conn->cm->CMTrace_file;
                _Var14 = getpid();
                pVar21 = pthread_self();
                fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_60);
                fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,
                        local_60.tv_nsec);
              }
              fprintf((FILE *)conn->cm->CMTrace_file,
                      "Calling connection unknown message failed with dereference %p\n",conn);
            }
            fflush((FILE *)conn->cm->CMTrace_file);
            INT_CMConnection_failed(conn);
            return 0;
          }
          bVar6 = false;
        }
        bVar23 = 0;
        bVar7 = false;
        bVar5 = false;
      }
    }
    else {
      if (uVar35 == 0x4d4c) {
        iVar12 = 0;
LAB_0011c91d:
        bVar23 = 0;
        goto LAB_0011c925;
      }
      if (uVar35 != 0x4d50) {
        if (uVar35 != 0x504d) goto LAB_0011cb41;
        bVar23 = 1;
        bVar5 = false;
        bVar6 = true;
        iVar12 = 1;
        bVar7 = true;
        goto LAB_0011c969;
      }
      bVar5 = false;
      bVar23 = 1;
      bVar6 = true;
      iVar12 = 1;
      bVar7 = true;
    }
    bVar8 = true;
    iVar13 = 0;
  }
  if (bVar5) {
    uVar32 = 0;
    if (bVar23 == 0) {
      uVar32 = (ulong)(uint)(iVar12 << 2);
    }
    uVar15 = 0x10;
    bVar31 = 0;
    bVar9 = 0;
  }
  else {
    bVar31 = bVar23 ^ 1;
    uVar15 = (ulong)bVar23 * 4 + 8;
    uVar32 = 0;
    bVar9 = bVar23;
  }
  if (length <= uVar15 && uVar15 - length != 0) {
    return uVar15 - length;
  }
  local_50 = CONCAT44(local_50._4_4_,iVar13);
  if (bVar23 == 0) {
    if (bVar8) {
      bVar23 = *buffer;
      uVar24 = (ulong)*(int *)(buffer + uVar32 + 4);
      if (bVar31 == 0) {
        uVar35 = *(uint *)(buffer + uVar32 + 8);
        goto LAB_0011ca41;
      }
    }
    else {
      bVar23 = buffer[3];
      uVar35 = *(uint *)(buffer + uVar32 + 4);
      uVar24 = (ulong)(int)(uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 |
                           uVar35 << 0x18);
      if (bVar31 == 0) {
        uVar35 = (uint)(byte)buffer[uVar32 + 0xb];
        uVar10 = (uint)(byte)buffer[uVar32 + 10];
        uVar11 = (uint)(byte)buffer[uVar32 + 8];
        uVar34 = (uint)(byte)buffer[uVar32 + 9];
        goto LAB_0011cab9;
      }
    }
LAB_0011caae:
    uVar35 = 0;
    uVar10 = 0;
    uVar34 = 0;
    uVar11 = 0;
  }
  else if (bVar8) {
    bVar23 = *buffer;
    uVar24 = *(ulong *)(buffer + uVar32 + 4);
    if (bVar9 != 0) goto LAB_0011caae;
    uVar35 = *(uint *)(buffer + uVar32 + 0xc);
LAB_0011ca41:
    uVar10 = uVar35 >> 8;
    uVar34 = uVar35 >> 0x10;
    uVar11 = uVar35 >> 0x18;
  }
  else {
    bVar23 = buffer[3];
    uVar35 = *(uint *)(buffer + uVar32 + 4);
    uVar10 = *(uint *)(buffer + uVar32 + 8);
    uVar24 = (long)(int)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                        uVar10 << 0x18) +
             ((ulong)(uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 |
                     uVar35 << 0x18) << 0x20);
    if (bVar9 != 0) goto LAB_0011caae;
    uVar35 = (uint)(byte)buffer[uVar32 + 0xf];
    uVar10 = (uint)(byte)buffer[uVar32 + 0xe];
    uVar11 = (uint)(byte)buffer[uVar32 + 0xc];
    uVar34 = (uint)(byte)buffer[uVar32 + 0xd];
  }
LAB_0011cab9:
  uVar33 = 0;
  uVar16 = (uVar24 & 0xffffffffffffff) - 0xc;
  if (!bVar7) {
    uVar16 = uVar24;
  }
  uVar25 = (uint)(byte)(uVar24 >> 0x38);
  if (!bVar7) {
    uVar25 = 0;
  }
  length_01 = (ulong)((uint)uVar16 & 0xffffff) - 8;
  if (bVar6) {
    length_01 = uVar16;
  }
  uVar22 = 0;
  uVar36 = 0;
  local_3c = 0;
  local_40 = 0;
  if ((char)iVar12 == '\0') {
    p_Var37 = cm;
    if (bVar5) {
      if (bVar8) {
        uVar33 = *(uint *)(buffer + uVar32 + 0xc);
        p_Var37 = (CManager)(ulong)uVar33;
        uVar36 = uVar33 >> 8;
        local_40 = uVar33 >> 0x10;
        uVar33 = uVar33 >> 0x18;
      }
      else {
        p_Var37 = (CManager)(ulong)(byte)buffer[uVar32 + 0xf];
        uVar36 = (uint)(byte)buffer[uVar32 + 0xe];
        uVar33 = (uint)(byte)buffer[uVar32 + 0xc];
        local_40 = (uint)(byte)buffer[uVar32 + 0xd];
      }
    }
    uVar33 = uVar33 << 0x18;
    uVar22 = (local_40 & 0xff) << 0x10;
    local_3c = (uVar36 & 0xff) << 8;
    local_40 = (uint)(byte)p_Var37;
  }
  uVar35 = uVar35 & 0xff | (uVar10 & 0xff) << 8 | (uVar34 & 0xff) << 0x10 | uVar11 << 0x18;
  lVar27 = uVar15 + (long)(int)uVar35 + length_01;
  sVar28 = lVar27 - length;
  if (sVar28 != 0 && (long)length <= lVar27) {
    return sVar28;
  }
  buffer_00 = (uint *)(buffer + uVar15);
  local_38 = cm_buffer;
  if (bVar6) {
    if (bVar23 != 0) {
      if (length == 4) {
        bVar9 = 0;
      }
      else {
        sVar28 = 5;
        if (5 < length) {
          sVar28 = length;
        }
        sVar29 = 4;
        bVar9 = 0;
        do {
          bVar9 = bVar9 + buffer[sVar29];
          sVar29 = sVar29 + 1;
        } while (sVar28 != sVar29);
      }
      if (bVar9 != bVar23) {
        printf("Discarding incoming message because of corruption.  Checksum mismatch got %x, expected %x\n"
               ,(ulong)bVar9,(ulong)bVar23);
        printf("Message was : ");
        lVar27 = 0;
        do {
          printf(" %02x",(ulong)(byte)buffer[lVar27]);
          lVar27 = lVar27 + 1;
        } while (length + (length == 0) != lVar27);
        putchar(10);
        return 0;
      }
    }
    if (bVar7) {
      CMdo_performance_response(conn,length_01,uVar25,iVar13,(char *)buffer_00);
      return 0;
    }
    local_50 = length_01;
    if (uVar35 == 0) {
      local_98 = (attr_list)0x0;
    }
    else {
      local_98 = CMint_decode_attr_from_xmit
                           (conn->cm,buffer_00,
                            "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                            ,0x9fc);
      iVar13 = CMtrace_val[4];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar13 = CMtrace_init(conn->cm,CMDataVerbose);
      }
      if (iVar13 != 0) {
        fwrite("CM - Incoming read attributes -> ",0x21,1,(FILE *)cm->CMTrace_file);
        fdump_attr_list(cm->CMTrace_file,local_98);
      }
    }
    data_buffer = (byte *)((long)buffer_00 + (long)(int)uVar35);
    if ((char)iVar12 == '\0') {
      iVar12 = CMtrace_val[4];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar12 = CMtrace_init(cm,CMDataVerbose);
      }
      if (iVar12 != 0) {
        if (CMtrace_PID != 0) {
          pFVar30 = (FILE *)cm->CMTrace_file;
          _Var14 = getpid();
          pVar21 = pthread_self();
          fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_60);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,
                "CM - Receiving event message data len %ld, attr len %d, stone_id %x\n",local_50,
                (ulong)uVar35,(ulong)(uVar22 | uVar33 | local_3c | local_40));
      }
      fflush((FILE *)cm->CMTrace_file);
      if (local_98 == (attr_list)0x0) {
        local_98 = CMint_create_attr_list
                             (cm,
                              "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                              ,0xa07);
      }
      set_int_attr(local_98,CM_EVENT_SIZE,local_50);
      set_long_attr(local_98,CM_INCOMING_CONNECTION,conn);
      if (local_38 == (CMbuffer)0x0) {
        p_Var20 = cm_get_data_buf(cm,length);
        memcpy(p_Var20->buffer,buffer,length);
        data_buffer = data_buffer + ((long)p_Var20->buffer - (long)buffer);
        cmb = p_Var20;
      }
      else {
        p_Var20 = local_38;
        cmb = (CMbuffer)0x0;
      }
      internal_cm_network_submit
                (cm,p_Var20,local_98,conn,data_buffer,local_50,uVar22 | uVar33 | local_3c | local_40
                );
      if (cmb != (CMbuffer)0x0) {
        cm_return_data_buf(cm,cmb);
      }
      free_attr_list(local_98);
      return 0;
    }
    uVar17 = FMContext_from_FFS(cm->FFScontext);
    lVar27 = FMformat_from_ID(uVar17,data_buffer);
    if (lVar27 == 0) {
      puts("BAD INCOMING DATA");
    }
    else {
      pcVar18 = (char *)name_of_FMformat(lVar27);
      if (0 < cm->reg_format_count) {
        lVar26 = 0;
        do {
          format = cm->reg_formats[lVar26];
          if ((format->registration_pending != 0) &&
             (iVar12 = strcmp(pcVar18,format->format_name), iVar12 == 0)) {
            CMcomplete_format_registration(format,0);
          }
          lVar26 = lVar26 + 1;
        } while (lVar26 < cm->reg_format_count);
      }
    }
    if (lVar27 == 0) {
      return 0;
    }
    lVar27 = FFS_target_from_encode(conn->cm->FFScontext,data_buffer);
    uVar17 = FFSTypeHandle_from_encode(conn->cm->FFScontext,data_buffer);
    if (lVar27 == 0) {
      p_Var1 = conn->cm->unregistered_format_handler;
      if (p_Var1 != (CMUnregCMHandler)0x0) {
        uVar17 = FMFormat_of_original(uVar17);
        pcVar18 = (char *)name_of_FMformat(uVar17);
        (*p_Var1)(conn,pcVar18);
        return 0;
      }
      CMact_on_data_cold_2();
      return 0;
    }
    iVar12 = CMtrace_val[4];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(cm,CMDataVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar30 = (FILE *)cm->CMTrace_file;
        _Var14 = getpid();
        pVar21 = pthread_self();
        fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      pFVar30 = (FILE *)cm->CMTrace_file;
      uVar19 = FMFormat_of_original(uVar17);
      uVar19 = name_of_FMformat(uVar19);
      fprintf(pFVar30,"CM - Receiving record of type %s, FFSformat %p\n",uVar19,uVar17);
    }
    fflush((FILE *)cm->CMTrace_file);
    if (cm->in_format_count < 1) {
      cm_format = (CMincoming_format_list)0x0;
    }
    else {
      lVar26 = 0;
      lVar38 = 0;
      cm_format = (CMincoming_format_list)0x0;
      do {
        if (*(long *)((long)&cm->in_formats->format + lVar26) == lVar27) {
          cm_format = (CMincoming_format_list)((long)&cm->in_formats->format + lVar26);
          iVar12 = CMtrace_val[4];
          if (cm->CMTrace_file == (FILE *)0x0) {
            iVar12 = CMtrace_init(cm,CMDataVerbose);
          }
          if (iVar12 != 0) {
            if (CMtrace_PID != 0) {
              pFVar30 = (FILE *)cm->CMTrace_file;
              _Var14 = getpid();
              pVar21 = pthread_self();
              fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_60);
              fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
            }
            fprintf((FILE *)cm->CMTrace_file,
                    "CM - Found incoming cm_format %p, matching FFSformat %p\n",cm_format,lVar27);
          }
          fflush((FILE *)cm->CMTrace_file);
        }
        lVar38 = lVar38 + 1;
        lVar26 = lVar26 + 0x48;
      } while (lVar38 < cm->in_format_count);
    }
    if (cm_format == (CMincoming_format_list)0x0) {
      cm_format = CMidentify_rollbackCMformat(cm,(char *)data_buffer);
      iVar12 = CMtrace_val[4];
      if (cm->CMTrace_file == (FILE *)0x0) {
        iVar12 = CMtrace_init(cm,CMDataVerbose);
      }
      if (iVar12 != 0) {
        if (CMtrace_PID != 0) {
          pFVar30 = (FILE *)cm->CMTrace_file;
          _Var14 = getpid();
          pVar21 = pthread_self();
          fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_60);
          fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
        }
        fprintf((FILE *)cm->CMTrace_file,"CM - Created cm_format %p, matching FFSformat %p\n",
                cm_format,uVar17);
      }
      fflush((FILE *)cm->CMTrace_file);
      if (cm_format == (CMincoming_format_list)0x0) {
        cm_format = (CMincoming_format_list)0x0;
      }
      else {
        iVar12 = CMtrace_val[4];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar12 = CMtrace_init(cm,CMDataVerbose);
        }
        if (iVar12 != 0) {
          if (CMtrace_PID != 0) {
            pFVar30 = (FILE *)cm->CMTrace_file;
            _Var14 = getpid();
            pVar21 = pthread_self();
            fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_60);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
          }
          pFVar30 = (FILE *)cm->CMTrace_file;
          uVar19 = FMFormat_of_original(uVar17);
          uVar19 = name_of_FMformat(uVar19);
          fprintf(pFVar30,"CM - Calling CMcreate_conversion type %s, format %p\n",uVar19,uVar17);
        }
        fflush((FILE *)cm->CMTrace_file);
        CMcreate_conversion(cm,cm_format);
        iVar12 = CMtrace_val[4];
        if (cm->CMTrace_file == (FILE *)0x0) {
          iVar12 = CMtrace_init(cm,CMDataVerbose);
        }
        if (iVar12 != 0) {
          if (CMtrace_PID != 0) {
            pFVar30 = (FILE *)cm->CMTrace_file;
            _Var14 = getpid();
            pVar21 = pthread_self();
            fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_60);
            fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
          }
          pFVar30 = (FILE *)cm->CMTrace_file;
          uVar35 = FFShas_conversion(uVar17);
          fprintf(pFVar30,"CM - after CMcreate_conversion format %p, has_conversion is %d\n",uVar17,
                  (ulong)uVar35);
        }
        fflush((FILE *)cm->CMTrace_file);
      }
    }
    if ((cm_format == (CMincoming_format_list)0x0) || (cm_format->handler == (CMHandlerFunc)0x0)) {
      CMact_on_data_cold_1();
      return 0;
    }
    iVar12 = FFShas_conversion(uVar17);
    if (iVar12 == 0) {
      CMcreate_conversion(cm,cm_format);
    }
    iVar12 = FFShas_conversion(uVar17);
    if (iVar12 == 0) {
      __assert_fail("FFShas_conversion(original_format)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xa51,"size_t CMact_on_data(CMConnection, CMbuffer, char *, size_t)");
    }
    iVar12 = FFSdecode_in_place_possible(uVar17);
    if (iVar12 == 0) {
      length_00 = FFS_est_decode_length(cm->FFScontext,data_buffer,local_50);
      local_a0 = cm_get_data_buf(cm,length_00);
      local_48 = local_a0->buffer;
      FFSdecode_to_buffer(cm->FFScontext,data_buffer);
    }
    else {
      iVar12 = FFSdecode_in_place(cm->FFScontext,data_buffer,&local_48);
      if (iVar12 == 0) {
        puts("Decode failed");
        return 0;
      }
      local_a0 = (CMbuffer)0x0;
    }
    iVar12 = CMtrace_val[4];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(conn->cm,CMDataVerbose);
    }
    if (iVar12 != 0) {
      if (CMact_on_data_size_set == '\0') {
        pcVar18 = getenv("CMDumpSize");
        CMact_on_data_size_set = '\x01';
        if (pcVar18 != (char *)0x0) {
          CMact_on_data::dump_char_limit = atoi(pcVar18);
        }
      }
      pFVar30 = (FILE *)cm->CMTrace_file;
      uVar19 = FMFormat_of_original(cm_format->format);
      uVar19 = name_of_FMformat(uVar19);
      fprintf(pFVar30,"CM - record type %s, contents are:\n  ",uVar19);
      pFVar2 = cm->CMTrace_file;
      uVar19 = FMFormat_of_original(cm_format->format);
      iVar12 = FMfdump_data(pFVar2,uVar19,local_48,CMact_on_data::dump_char_limit);
      if (iVar12 == 0 && CMact_on_data::warned == 0) {
        puts("\n\n  ****  Warning **** CM record dump truncated");
        puts("  To change size limits, set CMDumpSize environment variable.");
        CMact_on_data::warned = CMact_on_data::warned + 1;
      }
      fwrite("\n=======\n",9,1,(FILE *)cm->CMTrace_file);
    }
    if (local_98 == (attr_list)0x0) {
      local_98 = CMint_create_attr_list
                           (cm,
                            "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                            ,0xa7c);
      l2 = conn->attrs;
      iVar12 = 0xa7d;
    }
    else {
      l2 = conn->attrs;
      iVar12 = 0xa7f;
    }
    CMint_attr_merge_lists
              (cm,local_98,l2,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
               ,iVar12);
    iVar12 = CMtrace_val[7];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(cm,CMFreeVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar30 = (FILE *)cm->CMTrace_file;
        _Var14 = getpid();
        pVar21 = pthread_self();
        fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"CM - add reference connection %p - handler\n",conn);
    }
    fflush((FILE *)cm->CMTrace_file);
    INT_CMConnection_add_reference(conn);
    p_Var3 = cm_format->handler;
    pvVar4 = cm_format->client_data;
    if (local_38 == (CMbuffer)0x0 && local_48 == (void *)0x0) {
      p_Var20 = cm_get_data_buf(cm,length);
      memcpy(p_Var20->buffer,buffer,length);
    }
    else {
      p_Var20 = (CMbuffer)0x0;
    }
    IntCManager_unlock(cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                       ,0xa8f);
    (*p_Var3)(cm,conn,local_48,pvVar4,local_98);
    IntCManager_lock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                     ,0xa91);
    if (p_Var20 != (CMbuffer)0x0) {
      cm_return_data_buf(cm,p_Var20);
    }
    iVar12 = CMtrace_val[7];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(cm,CMFreeVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar30 = (FILE *)cm->CMTrace_file;
        _Var14 = getpid();
        pVar21 = pthread_self();
        fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"CM - delete reference connection %p - handler\n",conn);
    }
    fflush((FILE *)cm->CMTrace_file);
    INT_CMConnection_dereference(conn);
    if (local_a0 != (CMbuffer)0x0) {
      cm_return_data_buf(cm,local_a0);
    }
    if (local_98 != (attr_list)0x0) {
      CMint_free_attr_list
                (cm,local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                 ,0xa9b);
    }
    iVar12 = CMtrace_val[4];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(cm,CMDataVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar30 = (FILE *)cm->CMTrace_file;
        _Var14 = getpid();
        pVar21 = pthread_self();
        fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      pFVar30 = (FILE *)cm->CMTrace_file;
      uVar17 = FMFormat_of_original(uVar17);
      uVar17 = name_of_FMformat(uVar17);
      fprintf(pFVar30,"CM - Finish processing - record of type %s\n",uVar17);
    }
    pFVar30 = (FILE *)cm->CMTrace_file;
    goto LAB_0011d303;
  }
  if (bVar8) {
    uVar35 = *buffer_00;
    uVar10 = buffer_00[1];
    uVar36 = uVar35 >> 8;
    uVar25 = uVar35 >> 0x10;
    uVar34 = uVar35 >> 0x18;
    uVar11 = uVar10 >> 8;
    uVar33 = uVar10 >> 0x10;
    bVar23 = (byte)(uVar10 >> 0x18);
  }
  else {
    uVar35 = (uint)*(byte *)((long)buffer_00 + 3);
    uVar36 = (uint)*(byte *)((long)buffer_00 + 2);
    uVar34 = (uint)(byte)*buffer_00;
    uVar25 = (uint)*(byte *)((long)buffer_00 + 1);
    uVar10 = (uint)*(byte *)((long)buffer_00 + 7);
    uVar11 = (uint)*(byte *)((long)buffer_00 + 6);
    uVar33 = (uint)*(byte *)((long)buffer_00 + 5);
    bVar23 = (byte)buffer_00[1];
  }
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar12 = CMtrace_init(cm,CMLowLevelVerbose);
    if (iVar12 != 0) goto LAB_0011cd05;
  }
  else if (CMtrace_val[3] != 0) {
LAB_0011cd05:
    if (CMtrace_PID != 0) {
      pFVar30 = (FILE *)conn->cm->CMTrace_file;
      _Var14 = getpid();
      pVar21 = pthread_self();
      fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_60);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
    }
    fwrite("CM - Received CONN handshake message\n",0x25,1,(FILE *)conn->cm->CMTrace_file);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  if (conn->remote_format_server_ID == 0) {
    conn->remote_format_server_ID =
         uVar35 & 0xff | (uVar36 & 0xff) << 8 | (uVar25 & 0xff) << 0x10 | uVar34 << 0x18;
    conn->remote_CManager_ID =
         uVar10 & 0xff |
         (uVar11 & 0xff) << 8 | (uVar33 & 0xff) << 0x10 | (uint)(bVar23 & 0x7f) << 0x18;
    iVar12 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar30 = (FILE *)conn->cm->CMTrace_file;
        _Var14 = getpid();
        pVar21 = pthread_self();
        fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"CM - CONN handshake condition %d\n",
              (ulong)(uint)conn->handshake_condition);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    if (conn->handshake_condition != -1) {
      INT_CMCondition_signal(conn->cm,conn->handshake_condition);
      conn->handshake_condition = -1;
    }
  }
  else if (conn->remote_format_server_ID ==
           (uVar35 & 0xff | (uVar36 & 0xff) << 8 | (uVar25 & 0xff) << 0x10 | uVar34 << 0x18)) {
    printf("Less Gaak.  Got a second handshake on connection 0x%p, remote id %x\n",conn);
  }
  else {
    printf("Gaak.  Got a second handshake on connection 0x%p, with a different format server ID %x vs. %x\n"
           ,conn);
  }
  if (-1 < (char)bVar23) {
    iVar12 = CMtrace_val[3];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(conn->cm,CMLowLevelVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar30 = (FILE *)conn->cm->CMTrace_file;
        _Var14 = getpid();
        pVar21 = pthread_self();
        fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      fwrite("CM - Sending CONN handshake message\n",0x24,1,(FILE *)conn->cm->CMTrace_file);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    send_and_maybe_wait_for_handshake(conn->cm,conn);
    return 0;
  }
  iVar12 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar12 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar12 != 0) {
    if (CMtrace_PID != 0) {
      pFVar30 = (FILE *)conn->cm->CMTrace_file;
      _Var14 = getpid();
      pVar21 = pthread_self();
      fprintf(pFVar30,"P%lxT%lx - ",(long)_Var14,pVar21);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_60);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
    }
    fwrite("CM - *NOT* Sending CONN handshake message\n",0x2a,1,(FILE *)conn->cm->CMTrace_file);
  }
  pFVar30 = (FILE *)conn->cm->CMTrace_file;
LAB_0011d303:
  fflush(pFVar30);
  return 0;
}

Assistant:

static size_t
 CMact_on_data(CMConnection conn, CMbuffer cm_buffer, char *buffer, size_t length)
 {
     char *base = buffer;
     char *check_sum_base = buffer;
     int byte_swap = 0;
     int get_attrs = 0;
     int skip = 0;
     int performance_msg = 0, event_msg = 0, evcontrol_msg = 0, handshake = 0;
     int performance_func = 0, handshake_version = 0;
     CMbuffer cm_decode_buf = NULL;
     attr_list attrs = NULL;
     int64_t data_length, decoded_length;
     int attr_length = 0, i;
     int header_len;
     int stone_id;
     char *decode_buffer = NULL, *data_buffer;
     FFSTypeHandle local_format, original_format;
     CManager cm = conn->cm;
     CMincoming_format_list cm_format = NULL;
     int message_key;
     unsigned char checksum;
     int short_length = 1;

     if (length < 4) {
	 return 4 - length;
     }
     message_key = 0x00ffff00 & *((int*)buffer);
     switch (message_key) {  /* assume 4-byte int */
     case 0x00444d00: /* \0DMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4400:  /* CMD\0 */
	 break;
     case 0x00424d00: /* \0BMC reversed byte order long msg*/
	 byte_swap = 1;
     case 0x004d4200:  /* CMB\0 long msg*/
	 short_length = 0;
	 get_attrs = 1;
	 break;
     case 0x00414d00: /* \0AMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4100:  /* CMA\0 */
	 get_attrs = 1;
	 break;
     case 0x00005645: /* \0CVE reversed byte order */
	 byte_swap = 1;
     case 0x45560000: /* EVC\0 */
	 evcontrol_msg = 1;
	 break;
     case 0x00504d00: /* \0PMC reversed byte order */
	 byte_swap = 1;
     case 0x004d5000:  /* CMP\0 */
	 performance_msg = 1;
	 short_length = 0;
	 break;
     case 0x004c4d00: /* \0LMC reversed byte order */
	 byte_swap = 1;
     case 0x004d4c00:  /* CML\0 */
	 event_msg = 1;
	 get_attrs = 1;
	 break;
     case 0x00484d00: /* \0HMC reversed byte order - handshake */
	 byte_swap = 1;
     case 0x004d4800:  /* CMH\0 - handshake */
	 handshake = 1;
	 get_attrs = 0;
	 break;
     default:
	 /*  non CM message */
	 /*  lookup registered message prefixes and try to find handler */
	 /*  otherwise give up */
       {
	   int ret;
	   CMbuffer local = NULL;
 #ifdef EVER_HAVE_HANDLERS_OTHER_THAN_PBIO
	   if (cm_buffer == NULL) {
	       local = fill_cmbuffer(cm, buffer, length);
	       buffer = local->buffer;
	   }
 #endif
	   CManager_unlock(cm);
	   switch (*(int*)buffer) {
	   case 0x5042494f:
	   case 0x4f494250:  /* incoming FFS format protocol message */
	     {
	       extern int CM_pbio_query(CMConnection conn, CMTransport trans,
					char *buffer, size_t length);
	       
	       size_t ret = CM_pbio_query(conn, conn->trans, buffer, length);
	       CManager_lock(cm);
	       return ret;
	     }
	   }
	   ret = CMdo_non_CM_handler(conn, *(int*)buffer, buffer, length);
	   CManager_lock(cm);
	   if (local) cm_return_data_buf(cm, local);
	   if (ret == -1) {
	       printf("Unknown message on connection %p, failed %d, closed %d, %x\n", conn, conn->failed, conn->closed, *(int*)buffer);
	       CMtrace_out(conn->cm, CMFreeVerbose, "Calling connection unknown message failed with dereference %p\n", conn);
	       INT_CMConnection_failed(conn);
	   }
	   return 0;
       }
     }

     if (get_attrs == 1) {
	 if (!event_msg) {
	     header_len = 16;/* magic plus two 4-byte sizes (attrs + data) */
	     skip = 4;
	 } else {
	     header_len = 16;
	 }
	 if (!short_length) {
	     header_len = 16; /* extra data length bytes */
	     skip = 0;
	 }
     } else {
	 if (short_length) {
	     header_len = 8; /* magic plus 4-byte size */
	 } else {
	     header_len = 12; /* magic plus 8-byte size */
	 }
     }

     if (length < header_len) {
	 return header_len - length;
     }
     base = buffer + 4 + skip; /* skip used data */
     if (short_length) {
	 if (byte_swap) {
	     int tmp;
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[0];
 #else
	     checksum = (unsigned char) check_sum_base[3];
 #endif
	     ((char*)&tmp)[0] = base[3];
	     ((char*)&tmp)[1] = base[2];
	     ((char*)&tmp)[2] = base[1];
	     ((char*)&tmp)[3] = base[0];
	     data_length = tmp;
	     if (header_len != 8) {
		 ((char*)&attr_length)[0] = base[7];
		 ((char*)&attr_length)[1] = base[6];
		 ((char*)&attr_length)[2] = base[5];
		 ((char*)&attr_length)[3] = base[4];
	     }
	 } else {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[3];
 #else
	     checksum = (unsigned char) check_sum_base[0];
 #endif
	     data_length = ((int *) base)[0];
	     if (header_len != 8) {
		 attr_length = ((int *) base)[1];
	     }
	 }
     } else {
	 if (byte_swap) {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[0];
 #else
	     checksum = (unsigned char) check_sum_base[3];
 #endif
	     int tmp;
	     ((char*)&tmp)[0] = base[3];
	     ((char*)&tmp)[1] = base[2];
	     ((char*)&tmp)[2] = base[1];
	     ((char*)&tmp)[3] = base[0];
	     data_length = ((int64_t)tmp) << 32;
	     ((char*)&tmp)[0] = base[7];
	     ((char*)&tmp)[1] = base[6];
	     ((char*)&tmp)[2] = base[5];
	     ((char*)&tmp)[3] = base[4];
	     data_length += tmp;
	     if (header_len != 12) {
		 ((char*)&attr_length)[0] = base[11];
		 ((char*)&attr_length)[1] = base[10];
		 ((char*)&attr_length)[2] = base[9];
		 ((char*)&attr_length)[3] = base[8];
	     }
	 } else {
 #ifdef WORDS_BIGENDIAN	    
	     checksum = (unsigned char) check_sum_base[3];
 #else
	     checksum = (unsigned char) check_sum_base[0];
 #endif
	     data_length = ((int64_t)(((unsigned int *) base)[1])) << 32;
	     data_length += ((unsigned int *) base)[0];
	     if (header_len != 12) {
		 attr_length = ((int *) base)[2];
	     }
	 }
     }
     if (performance_msg || evcontrol_msg) {
	 performance_func = 0xff & (data_length >> 56);
	 data_length &= 0xffffffffffffff;
	 data_length -= 12;  /* subtract off header size */
     }
     if (handshake) {
	 handshake_version = 0xff & (data_length >> 24);
	 data_length &= 0xffffff;
	 data_length -= 8;  /* subtract off header size */
     }
     if (event_msg) {
	 char *stone_base = base;
	 if (header_len == 16) {
	     if (byte_swap) {
		 ((char*)&stone_id)[0] = stone_base[11];
		 ((char*)&stone_id)[1] = stone_base[10];
		 ((char*)&stone_id)[2] = stone_base[9];
		 ((char*)&stone_id)[3] = stone_base[8];
	     } else {
		 stone_id = ((int *) stone_base)[2];
	     }
	 } else if (header_len == 20) {
	     if (byte_swap) {
		 ((char*)&stone_id)[0] = stone_base[15];
		 ((char*)&stone_id)[1] = stone_base[14];
		 ((char*)&stone_id)[2] = stone_base[13];
		 ((char*)&stone_id)[3] = stone_base[12];
	     } else {
		 stone_id = ((int *) stone_base)[3];
	     }
	 }
     }

     if ((ssize_t)length < header_len + data_length + attr_length) {
	 return header_len + data_length + attr_length - 
	     length;
     }
     /* At this point, the message is accepted.  Determine processing */
     base = buffer + header_len;
     if (handshake) {
	 CMdo_handshake(conn, handshake_version, byte_swap, base);
	 return 0;
     }
     if (checksum != 0) {
	 unsigned char calculated_checksum = 0;
	 for (i=4; i < length; i++) {
	     calculated_checksum += ((unsigned char *)buffer)[i];
	 }
	 if (calculated_checksum != checksum) {
	     printf("Discarding incoming message because of corruption.  Checksum mismatch got %x, expected %x\n",
		    calculated_checksum, checksum);
	     printf("Message was : ");
	     for (i=0 ; i < length; i++) {
		 printf(" %02x",  ((unsigned char *)buffer)[i]);
	     }
	     printf("\n");
	     return 0;
	 }
     }
     if (performance_msg) {
	 CMdo_performance_response(conn, data_length, performance_func, byte_swap,
				   base);
	 return 0;
     } else if (evcontrol_msg) {
	 int arg;
	 if (byte_swap) {
	     ((char*)&arg)[0] = base[3];
	     ((char*)&arg)[1] = base[2];
	     ((char*)&arg)[2] = base[1];
	     ((char*)&arg)[3] = base[0];
	 } else {
	     arg = ((int *) base)[0];
	 }
 #ifdef EV_INTERNAL_H
	 INT_EVhandle_control_message(conn->cm, conn, (unsigned char) performance_func, arg);
 #endif
	 return 0;
     }
     data_buffer = base + attr_length;
     if (attr_length != 0) {
	 attrs = CMdecode_attr_from_xmit(conn->cm, base);
	 if (CMtrace_on(conn->cm, CMDataVerbose)) {
	     fprintf(cm->CMTrace_file, "CM - Incoming read attributes -> ");
	     fdump_attr_list(cm->CMTrace_file, attrs);
	 }
     }
     if (event_msg) {
	 CMbuffer local = NULL;
	 CMtrace_out(cm, CMDataVerbose, "CM - Receiving event message data len %"  PRId64 ", attr len %d, stone_id %x\n",
		     data_length, attr_length, stone_id);
	 if (attrs == NULL){
	     attrs = CMcreate_attr_list(cm);
	 }
	 set_int_attr(attrs, CM_EVENT_SIZE, (int)data_length);
	 set_long_attr(attrs, CM_INCOMING_CONNECTION, (intptr_t)conn);

	 if (cm_buffer == NULL) {
	     local = fill_cmbuffer(cm, buffer, length);
	     data_buffer = (data_buffer - buffer) + (char*)local->buffer;
	     buffer = local->buffer;
	     cm_buffer = local;
	 }
 #ifdef EV_INTERNAL_H	
	 internal_cm_network_submit(cm, cm_buffer, attrs, conn, data_buffer,
				    data_length, stone_id);
 #endif
	 if (local) cm_return_data_buf(cm, local);
	 free_attr_list(attrs);
	 return 0;
     }
     {
	 FMFormat format = FMformat_from_ID(FMContext_from_FFS(cm->FFScontext), data_buffer);
	 char *incoming_name;
	 if (format == NULL) {
	     printf("BAD INCOMING DATA\n");
	     return 0;
	 }
	 incoming_name = name_of_FMformat(format);

	 for (i = 0; i < cm->reg_format_count; i++) {
	     if ((cm->reg_formats[i]->registration_pending) && 
		 (strcmp(incoming_name, cm->reg_formats[i]->format_name) == 0)) {
		 CMcomplete_format_registration(cm->reg_formats[i], 0);
	     }
	 }
     }
     local_format = FFS_target_from_encode(conn->cm->FFScontext, data_buffer);
     original_format = FFSTypeHandle_from_encode(conn->cm->FFScontext, data_buffer);
     if (local_format == NULL) {
	 if (conn->cm->unregistered_format_handler) {
	     conn->cm->unregistered_format_handler(conn, name_of_FMformat(FMFormat_of_original(original_format)));
	 } else {
	     fprintf(stderr, "No conversion found for incoming CM message\n");
	 }
	 return 0;
     }
     CMtrace_out(cm, CMDataVerbose, "CM - Receiving record of type %s, FFSformat %p\n", 
		 name_of_FMformat(FMFormat_of_original(original_format)), original_format);
     for (i=0; i< cm->in_format_count; i++) {
	 if (cm->in_formats[i].format == local_format) {
	     cm_format = &cm->in_formats[i];
	     CMtrace_out(cm, CMDataVerbose, "CM - Found incoming cm_format %p, matching FFSformat %p\n", 
			 cm_format, local_format);
	 }
     }
     if (cm_format == NULL) {
	 cm_format = CMidentify_rollbackCMformat(cm, data_buffer);
	 CMtrace_out(cm, CMDataVerbose, "CM - Created cm_format %p, matching FFSformat %p\n", 
		     cm_format, original_format);
	 if(cm_format) {
	     CMtrace_out(cm, CMDataVerbose, "CM - Calling CMcreate_conversion type %s, format %p\n", 
			 name_of_FMformat(FMFormat_of_original(original_format)), original_format);
	     CMcreate_conversion(cm, cm_format);
	     CMtrace_out(cm, CMDataVerbose, "CM - after CMcreate_conversion format %p, has_conversion is %d\n", 
			 original_format, FFShas_conversion(original_format));
	 }
     }

     if ((cm_format == NULL) || (cm_format->handler == NULL)) {
	 fprintf(stderr, "CM - No handler for incoming data of this version of format \"%s\"\n",
		 name_of_FMformat(FMFormat_of_original(original_format)));
	 return 0;
     } else if (!FFShas_conversion(original_format)) {
	 CMcreate_conversion(cm, cm_format);
     }
     assert(FFShas_conversion(original_format));

     if (FFSdecode_in_place_possible(original_format)) {
	 if (!FFSdecode_in_place(cm->FFScontext, data_buffer, 
					(void**) (intptr_t) &decode_buffer)) {
	     printf("Decode failed\n");
	     return 0;
	 }
     } else {
	 decoded_length = FFS_est_decode_length(cm->FFScontext, data_buffer, data_length);
	 cm_decode_buf = cm_get_data_buf(cm, decoded_length);
	 decode_buffer = cm_decode_buf->buffer;
	 FFSdecode_to_buffer(cm->FFScontext, data_buffer, decode_buffer);
     }
     if(cm_format->older_format) {
 #ifdef EVOL
	 if(!process_old_format_data(cm, cm_format, &decode_buffer, &cm_decode_buf)){
	     return 0;
	 }
 #endif
     }
     if (CMtrace_on(conn->cm, CMDataVerbose)) {
	 static int dump_char_limit = 256;
	 static int warned = 0;
	 static int size_set = 0;
	 int r;
	 if (size_set == 0) {
	     char *size_str = getenv("CMDumpSize");
	     size_set++;
	     if (size_str != NULL) {
		 dump_char_limit = atoi(size_str);
	     }
	 }
	 fprintf(cm->CMTrace_file, "CM - record type %s, contents are:\n  ", name_of_FMformat(FMFormat_of_original(cm_format->format)));
	 r = FMfdump_data(cm->CMTrace_file, FMFormat_of_original(cm_format->format), decode_buffer, dump_char_limit);
	 if (!r && !warned) {
	     printf("\n\n  ****  Warning **** CM record dump truncated\n");
	     printf("  To change size limits, set CMDumpSize environment variable.\n");
	     warned++;
	 }
	 fprintf(cm->CMTrace_file, "\n=======\n");
     }
     if (attrs == NULL) {
	 attrs = CMcreate_attr_list(cm);
	 CMattr_merge_lists(cm, attrs, conn->attrs);
     } else {
	 CMattr_merge_lists(cm, attrs, conn->attrs);
     }

     /* 
      *  Handler may recurse, so clear these structures first
      */
     CMtrace_out(cm, CMFreeVerbose, "CM - add reference connection %p - handler\n", conn);
     INT_CMConnection_add_reference(conn);
     {
         CMHandlerFunc handler = cm_format->handler;
	 void *client_data = cm_format->client_data;
	 CMbuffer local = NULL;
	 if ((cm_buffer == NULL) && (decode_buffer == NULL)) {
	     local = fill_cmbuffer(cm, buffer, length);
	     buffer = local->buffer;
	 }
	 CManager_unlock(cm);
	 handler(cm, conn, decode_buffer, client_data, attrs);
	 CManager_lock(cm);
	 if (local) cm_return_data_buf(cm, local);
	 CMtrace_out(cm, CMFreeVerbose, "CM - delete reference connection %p - handler\n", conn);
	 INT_CMConnection_dereference(conn);
     }
     if (cm_decode_buf) {
	 cm_return_data_buf(cm, cm_decode_buf);
	 cm_decode_buf = NULL;
     }
     if (attrs) {
	 INT_CMfree_attr_list(cm, attrs);
	 attrs = NULL;
     }
     CMtrace_out(cm, CMDataVerbose, "CM - Finish processing - record of type %s\n", 
		 name_of_FMformat(FMFormat_of_original(original_format)));
     return 0;
 }